

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knote.c
# Opt level: O0

knote * knote_index_RB_NEXT(knote *elm)

{
  bool bVar1;
  knote *elm_local;
  
  if ((elm->kn_index).rbe_right == (knote *)0x0) {
    elm_local = elm;
    if (((elm->kn_index).rbe_parent == (knote *)0x0) ||
       (elm != (((elm->kn_index).rbe_parent)->kn_index).rbe_left)) {
      while( true ) {
        bVar1 = false;
        if ((elm_local->kn_index).rbe_parent != (knote *)0x0) {
          bVar1 = elm_local == (((elm_local->kn_index).rbe_parent)->kn_index).rbe_right;
        }
        if (!bVar1) break;
        elm_local = (elm_local->kn_index).rbe_parent;
      }
      elm_local = (elm_local->kn_index).rbe_parent;
    }
    else {
      elm_local = (elm->kn_index).rbe_parent;
    }
  }
  else {
    for (elm_local = (elm->kn_index).rbe_right; (elm_local->kn_index).rbe_left != (knote *)0x0;
        elm_local = (elm_local->kn_index).rbe_left) {
    }
  }
  return elm_local;
}

Assistant:

struct knote *
knote_new(void)
{
    struct knote *res;

    res = calloc(1, sizeof(struct knote));
    if (res == NULL)
        return (NULL);

    res->kn_ref = 1;

    return (res);
}